

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void __thiscall duckdb_re2::Regexp::ParseState::DoConcatenation(ParseState *this)

{
  Regexp *this_00;
  
  if ((this->stacktop_ == (Regexp *)0x0) || (0x15 < this->stacktop_->op_)) {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpEmptyMatch,this->flags_);
    PushRegexp(this,this_00);
  }
  DoCollapse(this,kRegexpConcat);
  return;
}

Assistant:

void Regexp::ParseState::DoConcatenation() {
  Regexp* r1 = stacktop_;
  if (r1 == NULL || IsMarker(r1->op())) {
    // empty concatenation is special case
    Regexp* re = new Regexp(kRegexpEmptyMatch, flags_);
    PushRegexp(re);
  }
  DoCollapse(kRegexpConcat);
}